

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::insertXrefEntry(QPDF *this,int obj,int f0,qpdf_offset_t f1,int f2)

{
  int stream_number;
  pointer pMVar1;
  size_type sVar2;
  pointer ppVar3;
  QPDFExc *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_bool> pVar4;
  int local_224;
  int local_204;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  QPDFXRefEntry local_188;
  QPDFXRefEntry local_170;
  type_conflict2 *local_158;
  type_conflict2 *created;
  type *iter;
  undefined1 local_140;
  QPDFObjGen local_138;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_bool> local_130;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_c9;
  string local_c8;
  QPDFExc local_a8;
  int local_28;
  int local_24;
  int new_gen;
  int f2_local;
  qpdf_offset_t f1_local;
  int f0_local;
  int obj_local;
  QPDF *this_local;
  
  local_204 = f2;
  if (f0 == 2) {
    local_204 = 0;
  }
  local_28 = local_204;
  local_24 = f2;
  _new_gen = f1;
  f1_local._0_4_ = f0;
  f1_local._4_4_ = obj;
  _f0_local = this;
  if ((((obj < 1) ||
       (pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m), pMVar1->xref_table_max_id < obj)) || (local_24 < 0)) ||
     (0xfffe < local_28)) {
    QTC::TC("qpdf","QPDF xref overwrite invalid objgen",0);
  }
  else {
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&pMVar1->deleted_objects,(key_type *)((long)&f1_local + 4));
    if (sVar2 == 0) {
      if (((int)f1_local == 2) && ((int)_new_gen == f1_local._4_4_)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"xref stream",&local_c9);
        std::__cxx11::to_string(&local_120,f1_local._4_4_);
        std::operator+(&local_100,"self-referential object stream ",&local_120);
        damagedPDF(&local_a8,this,&local_c8,&local_100);
        warn(this,&local_a8);
        QPDFExc::~QPDFExc(&local_a8);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      else {
        pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        if ((int)f1_local == 2) {
          local_224 = 0;
        }
        else {
          local_224 = local_24;
        }
        QPDFObjGen::QPDFObjGen(&local_138,f1_local._4_4_,local_224);
        pVar4 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::try_emplace<>(&pMVar1->xref_table,&local_138);
        iter = (type *)pVar4.first._M_node;
        local_140 = pVar4.second;
        local_130.first._M_node = (_Base_ptr)iter;
        local_130.second = (bool)local_140;
        created = (type_conflict2 *)
                  std::
                  get<0ul,std::_Rb_tree_iterator<std::pair<QPDFObjGen_const,QPDFXRefEntry>>,bool>
                            (&local_130);
        local_158 = std::
                    get<1ul,std::_Rb_tree_iterator<std::pair<QPDFObjGen_const,QPDFXRefEntry>>,bool>
                              (&local_130);
        if ((*local_158 & 1U) == 0) {
          QTC::TC("qpdf","QPDF xref reused object",0);
        }
        else if ((int)f1_local == 1) {
          QTC::TC("qpdf","QPDF xref gen > 0",(uint)(0 < local_24));
          QPDFXRefEntry::QPDFXRefEntry(&local_170,_new_gen);
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> *)
                              created);
          (ppVar3->second).type = local_170.type;
          *(undefined4 *)&(ppVar3->second).field_0x4 = local_170._4_4_;
          (ppVar3->second).field1 = local_170.field1;
          (ppVar3->second).field2 = local_170.field2;
        }
        else {
          if ((int)f1_local != 2) {
            __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a8,"xref stream",&local_1a9);
            std::__cxx11::to_string(&local_1f0,(int)f1_local);
            std::operator+(&local_1d0,"unknown xref stream entry type ",&local_1f0);
            damagedPDF(__return_storage_ptr__,this,&local_1a8,&local_1d0);
            __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          stream_number = toI<long_long>((longlong *)&new_gen);
          QPDFXRefEntry::QPDFXRefEntry(&local_188,stream_number,local_24);
          ppVar3 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> *)
                              created);
          (ppVar3->second).type = local_188.type;
          *(undefined4 *)&(ppVar3->second).field_0x4 = local_188._4_4_;
          (ppVar3->second).field1 = local_188.field1;
          (ppVar3->second).field2 = local_188.field2;
        }
      }
    }
    else {
      QTC::TC("qpdf","QPDF xref deleted object",0);
    }
  }
  return;
}

Assistant:

void
QPDF::insertXrefEntry(int obj, int f0, qpdf_offset_t f1, int f2)
{
    // Populate the xref table in such a way that the first reference to an object that we see,
    // which is the one in the latest xref table in which it appears, is the one that gets stored.
    // This works because we are reading more recent appends before older ones.

    // If there is already an entry for this object and generation in the table, it means that a
    // later xref table has registered this object.  Disregard this one.
    int new_gen = f0 == 2 ? 0 : f2;

    if (!(obj > 0 && obj <= m->xref_table_max_id && 0 <= f2 && new_gen < 65535)) {
        // We are ignoring invalid objgens. Most will arrive here from xref reconstruction. There
        // is probably no point having another warning but we could count invalid items in order to
        // decide when to give up.
        QTC::TC("qpdf", "QPDF xref overwrite invalid objgen");
        // ignore impossibly large object ids or object ids > Size.
        return;
    }

    if (m->deleted_objects.count(obj)) {
        QTC::TC("qpdf", "QPDF xref deleted object");
        return;
    }

    if (f0 == 2 && static_cast<int>(f1) == obj) {
        warn(damagedPDF("xref stream", "self-referential object stream " + std::to_string(obj)));
        return;
    }

    auto [iter, created] = m->xref_table.try_emplace(QPDFObjGen(obj, (f0 == 2 ? 0 : f2)));
    if (!created) {
        QTC::TC("qpdf", "QPDF xref reused object");
        return;
    }

    switch (f0) {
    case 1:
        // f2 is generation
        QTC::TC("qpdf", "QPDF xref gen > 0", ((f2 > 0) ? 1 : 0));
        iter->second = QPDFXRefEntry(f1);
        break;

    case 2:
        iter->second = QPDFXRefEntry(toI(f1), f2);
        break;

    default:
        throw damagedPDF("xref stream", "unknown xref stream entry type " + std::to_string(f0));
        break;
    }
}